

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O2

size_t __thiscall ag::Generator::FunctionManager::If(FunctionManager *this)

{
  size_t sVar1;
  pointer pvVar2;
  pointer pBVar3;
  long lVar4;
  long lVar5;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ByteCode::Add((this->m_code).super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>.
                _M_impl.super__Vector_impl_data._M_start + this->m_cur,If);
  sVar1 = this->m_cur;
  pvVar2 = (this->m_linkAddr).
           super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)*(pointer *)
                 ((long)&pvVar2[sVar1].
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data + 8) -
          *(long *)&pvVar2[sVar1].
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::resize(pvVar2 + sVar1,(lVar5 >> 4) + 1);
  pBVar3 = (this->m_code).super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar1 = this->m_cur;
  lVar4 = *(long *)&(this->m_linkAddr).
                    super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar1].
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data;
  *(long *)(lVar4 + lVar5) =
       (long)*(pointer *)
              ((long)&pBVar3[sVar1].m_bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8)
       - *(long *)&pBVar3[sVar1].m_bytes.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
  *(undefined8 *)(lVar4 + 8 + lVar5) = 0;
  BitConverter::GetUInt32((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,0);
  ByteCode::Add(pBVar3 + sVar1,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return lVar5 >> 4;
}

Assistant:

inline size_t If()
			{
				m_code[m_cur].Add(OpCode::If);

				size_t cur_if = m_linkAddr[m_cur].size();
				m_linkAddr[m_cur].resize(cur_if + 1);
				m_linkAddr[m_cur][cur_if] = std::make_pair(m_code[m_cur].Count(), 0);

				m_code[m_cur].Add(BitConverter::GetUInt32(0u));

				return cur_if;
			}